

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::openScope(Parser *this,vardef_t *vardef)

{
  FILE *__stream;
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>
  local_60;
  
  (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_60);
  bVar1 = checkVarExists(this,&local_60.first);
  std::__cxx11::string::~string((string *)&local_60);
  __stream = _stdout;
  if (!bVar1) {
    (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_60);
    fprintf(__stream,"\x1b[33m\t{{{ Variable [%s] open scope\n\x1b[0m",
            local_60.first._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    vardef->defined = true;
    (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_80);
    local_60.first._M_dataplus._M_p = (pointer)&local_60.first.field_2;
    if (local_80 == &local_70) {
      local_60.first.field_2._8_8_ = local_70._8_8_;
    }
    else {
      local_60.first._M_dataplus._M_p = (pointer)local_80;
    }
    local_60.first._M_string_length = local_78;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_60.second.name = vardef->name;
    local_60.second.defined = vardef->defined;
    local_60.second.isConst = vardef->isConst;
    local_60.second._10_6_ = *(undefined6 *)&vardef->field_0xa;
    local_60.second.type = vardef->type;
    local_80 = &local_70;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Parser::vardef_t>,std::_Select1st<std::pair<std::__cxx11::string_const,Parser::vardef_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Parser::vardef_t>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Parser::vardef_t>,std::_Select1st<std::pair<std::__cxx11::string_const,Parser::vardef_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
                *)&this->var_table,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    return;
  }
  (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_60);
  fprintf(__stream,"\x1b[31m\tVariable [%s] already declared.\n\x1b[0m",
          local_60.first._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  exit(1);
}

Assistant:

void Parser::openScope(vardef_t *vardef) {
    // First check if var exists, if it does, we have a problem
    if (checkVarExists(vardef->name->describe())) {
        fprintf(stdout, ANSI_COLOR_RED "\tVariable [%s] already declared.\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_YELLOW "\t{{{ Variable [%s] open scope\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
    }

    // Add to var_table
    vardef->defined = true;
    var_table.insert(std::pair<std::string, vardef_t>(vardef->name->describe(), *vardef));
}